

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  pointer pLVar1;
  cmGeneratorTarget *pcVar2;
  cmake *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar5;
  char *val;
  string *__rhs;
  _Base_ptr p_Var6;
  ostream *poVar7;
  ArtifactType artifact;
  PolicyID id;
  LinkType lt;
  LinkEntry *linkEntry;
  pointer item;
  string local_470;
  string *local_450;
  string *local_448;
  undefined1 local_440 [32];
  ostringstream w;
  cmComputeLinkDepends cld;
  
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar4 == EXECUTABLE) ||
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == SHARED_LIBRARY)) ||
      (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY)) ||
     (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == STATIC_LIBRARY)) {
    if ((this->LinkLanguage)._M_string_length != 0) {
      local_448 = &this->Config;
      cmComputeLinkDepends::cmComputeLinkDepends(&cld,this->Target,local_448);
      cmComputeLinkDepends::SetOldLinkDirMode(&cld,this->OldLinkDirMode);
      pvVar5 = cmComputeLinkDepends::Compute(&cld);
      local_450 = (string *)&this->LinkLanguage;
      pLVar1 = (pvVar5->
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (item = (pvVar5->
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; item != pLVar1; item = item + 1) {
        if (item->IsSharedDep == true) {
          AddSharedDepItem(this,&item->Item,item->Target);
        }
        else {
          AddItem(this,&item->Item,item->Target);
        }
      }
      pcVar2 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&w,"LINK_SEARCH_END_STATIC",(allocator<char> *)&local_470);
      val = cmGeneratorTarget::GetProperty(pcVar2,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
      bVar3 = cmSystemTools::IsOn(val);
      if (bVar3) {
        lt = LinkStatic;
      }
      else {
        lt = this->StartLinkType;
      }
      SetCurrentLinkType(this,lt);
      if (this->OldLinkDirMode == true) {
        for (p_Var6 = cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header
            ; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          pcVar2 = *(cmGeneratorTarget **)(p_Var6 + 1);
          artifact = RuntimeBinaryArtifact;
          if (this->UseImportLibrary == true) {
            TVar4 = cmGeneratorTarget::GetType(pcVar2);
            artifact = (ArtifactType)(TVar4 == SHARED_LIBRARY);
          }
          cmGeneratorTarget::GetFullPath((string *)&w,pcVar2,local_448,artifact,true);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->OldLinkDirItems,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
        }
      }
      bVar3 = FinishLinkerSearchDirectories(this);
      if ((bVar3) &&
         (AddImplicitLinkInfo(this),
         (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_470,(cmPolicies *)0x3c,id);
        poVar7 = std::operator<<((ostream *)&w,(string *)&local_470);
        poVar7 = std::operator<<(poVar7,
                                 "\nSome library files are in directories implicitly searched by the linker when invoked for "
                                );
        poVar7 = std::operator<<(poVar7,local_450);
        poVar7 = std::operator<<(poVar7,":\n ");
        cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_440,&this->CMP0060WarnItems,"\n ");
        poVar7 = std::operator<<(poVar7,(string *)local_440);
        std::operator<<(poVar7,
                        "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                       );
        std::__cxx11::string::~string((string *)local_440);
        std::__cxx11::string::~string((string *)&local_470);
        this_00 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_440);
        cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_470,(cmListFileBacktrace *)local_440);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_440 + 8));
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
      cmComputeLinkDepends::~cmComputeLinkDepends(&cld);
      return bVar3;
    }
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cld,
                   "CMake can not determine linker language for target: ",__rhs);
    cmSystemTools::Error((string *)&cld);
    std::__cxx11::string::~string((string *)&cld);
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.IsSharedDep) {
      this->AddSharedDepItem(linkEntry.Item, linkEntry.Target);
    } else {
      this->AddItem(linkEntry.Item, linkEntry.Target);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmSystemTools::IsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      bool implib = (this->UseImportLibrary &&
                     (tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}